

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_state.hpp
# Opt level: O0

void duckdb::QuantileOperation::
     Destroy<duckdb::QuantileState<signed_char,duckdb::QuantileStandardType>>
               (QuantileState<signed_char,_duckdb::QuantileStandardType> *state,
               AggregateInputData *param_2)

{
  QuantileState<signed_char,_duckdb::QuantileStandardType> *in_RSI;
  
  QuantileState<signed_char,_duckdb::QuantileStandardType>::~QuantileState(in_RSI);
  return;
}

Assistant:

static void Destroy(STATE &state, AggregateInputData &) {
		state.~STATE();
	}